

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirinfo.c
# Opt level: O3

int tagCompare(void *a,void *b)

{
  int iVar1;
  
  iVar1 = **a - **b;
  if (iVar1 == 0) {
    iVar1 = (*a)[2];
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = (*b)[2] - iVar1;
  }
  return iVar1;
}

Assistant:

static int tagCompare(const void *a, const void *b)
{
    const TIFFField *ta = *(const TIFFField **)a;
    const TIFFField *tb = *(const TIFFField **)b;
    /* NB: be careful of return values for 16-bit platforms */
    if (ta->field_tag != tb->field_tag)
        return (int)ta->field_tag - (int)tb->field_tag;
    else
        return (ta->field_type == TIFF_ANY)
                   ? 0
                   : ((int)tb->field_type - (int)ta->field_type);
}